

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O3

FT_UInt tt_cmap2_char_index(TT_CMap cmap,FT_UInt32 char_code)

{
  uint uVar1;
  ushort *puVar2;
  uint uVar3;
  ushort uVar4;
  
  puVar2 = (ushort *)tt_cmap2_get_subheader(cmap->data,char_code);
  uVar1 = 0;
  if ((((puVar2 != (ushort *)0x0) &&
       (uVar3 = (char_code & 0xff) - (uint)(ushort)(*puVar2 << 8 | *puVar2 >> 8), uVar1 = 0,
       uVar3 < (ushort)(puVar2[1] << 8 | puVar2[1] >> 8))) &&
      (uVar4 = puVar2[3] << 8 | puVar2[3] >> 8, uVar1 = 0, uVar4 != 0)) &&
     (uVar4 = *(ushort *)((long)puVar2 + (ulong)uVar4 + (ulong)uVar3 * 2 + 6),
     uVar4 = uVar4 << 8 | uVar4 >> 8, uVar4 != 0)) {
    uVar1 = (uint)(ushort)(uVar4 + (puVar2[2] << 8 | puVar2[2] >> 8));
  }
  return uVar1;
}

Assistant:

FT_CALLBACK_DEF( FT_UInt )
  tt_cmap2_char_index( TT_CMap    cmap,
                       FT_UInt32  char_code )
  {
    FT_Byte*  table   = cmap->data;
    FT_UInt   result  = 0;
    FT_Byte*  subheader;


    subheader = tt_cmap2_get_subheader( table, char_code );
    if ( subheader )
    {
      FT_Byte*  p   = subheader;
      FT_UInt   idx = (FT_UInt)( char_code & 0xFF );
      FT_UInt   start, count;
      FT_Int    delta;
      FT_UInt   offset;


      start  = TT_NEXT_USHORT( p );
      count  = TT_NEXT_USHORT( p );
      delta  = TT_NEXT_SHORT ( p );
      offset = TT_PEEK_USHORT( p );

      idx -= start;
      if ( idx < count && offset != 0 )
      {
        p  += offset + 2 * idx;
        idx = TT_PEEK_USHORT( p );

        if ( idx != 0 )
          result = (FT_UInt)( (FT_Int)idx + delta ) & 0xFFFFU;
      }
    }

    return result;
  }